

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O1

upb_MessageValue
upb_Message_GetField(upb_Message *msg,upb_MiniTableField *field,upb_MessageValue default_val)

{
  byte bVar1;
  ushort uVar2;
  upb_Extension *puVar3;
  ulong uVar4;
  bool bVar5;
  upb_MessageValue uVar6;
  
  uVar4 = default_val.uint64_val;
  bVar1 = field->mode_dont_copy_me__upb_internal_use_only;
  if ((bVar1 & 8) == 0) {
    uVar2 = field->presence;
    if (-1 < (short)uVar2) {
      uVar6 = (upb_MessageValue)
              (*(code *)(&DAT_004987d8 + *(int *)(&DAT_004987d8 + (ulong)(bVar1 >> 6) * 4)))
                        (msg,&DAT_004987d8,
                         &DAT_004987d8 + *(int *)(&DAT_004987d8 + (ulong)(bVar1 >> 6) * 4));
      return uVar6;
    }
    if (uVar2 == 0) {
      __assert_fail("upb_MiniTableField_HasPresence(field)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0xfa,
                    "_Bool upb_Message_HasBaseField(const struct upb_Message *, const upb_MiniTableField *)"
                   );
    }
    if ((short)uVar2 < 0) {
      bVar5 = *(uint32_t *)((long)&msg->field_0 + (ulong)(uVar2 ^ 0xffff)) ==
              field->number_dont_copy_me__upb_internal_use_only;
    }
    else {
      bVar5 = (*(byte *)((long)&msg->field_0 + (ulong)(uVar2 >> 3)) >> (uVar2 & 7) & 1) != 0;
    }
    if (bVar5) {
      uVar6 = (upb_MessageValue)
              (*(code *)(&DAT_004987e8 + *(int *)(&DAT_004987e8 + (ulong)(bVar1 >> 6) * 4)))();
      return uVar6;
    }
  }
  else {
    puVar3 = _upb_Message_Getext_dont_copy_me__upb_internal_use_only
                       (msg,(upb_MiniTableExtension *)field);
    bVar1 = field->mode_dont_copy_me__upb_internal_use_only;
    if ((bVar1 & 8) == 0) {
      __assert_fail("upb_MiniTableField_IsExtension(f)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0x11d,
                    "void _upb_Message_GetExtensionField(const struct upb_Message *, const upb_MiniTableExtension *, const void *, void *)"
                   );
    }
    if (puVar3 != (upb_Extension *)0x0) {
      uVar6 = (upb_MessageValue)
              (*(code *)(&DAT_004987c8 + *(int *)(&DAT_004987c8 + (ulong)(bVar1 >> 6) * 4)))();
      return uVar6;
    }
  }
  if (1 < (bVar1 >> 6) - 2) {
    if (bVar1 >> 6 == 1) {
      uVar4 = uVar4 & 0xffffffff;
    }
    else {
      uVar4 = uVar4 & 0xff;
    }
  }
  uVar6.str_val.size = default_val.str_val.size;
  uVar6.uint64_val = uVar4;
  return uVar6;
}

Assistant:

UPB_API_INLINE upb_MessageValue upb_Message_GetField(
    const struct upb_Message* msg, const upb_MiniTableField* field,
    upb_MessageValue default_val) {
  upb_MessageValue ret;
  if (upb_MiniTableField_IsExtension(field)) {
    _upb_Message_GetExtensionField(msg, (upb_MiniTableExtension*)field,
                                   &default_val, &ret);
  } else {
    _upb_Message_GetNonExtensionField(msg, field, &default_val, &ret);
  }
  return ret;
}